

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int lua_resume(lua_State *L,lua_State *from,int nargs,int *nresults)

{
  TStatus status_00;
  byte errcode;
  int iVar1;
  anon_union_4_3_18ab96e6_for_u2 local_3c;
  uint local_38;
  TStatus status;
  int *nresults_local;
  lua_State *plStack_20;
  int nargs_local;
  lua_State *from_local;
  lua_State *L_local;
  
  nresults_local._4_4_ = nargs;
  plStack_20 = from;
  from_local = L;
  if (L->status == '\0') {
    if (L->ci != &L->base_ci) {
      iVar1 = resume_error(L,"cannot resume non-suspended coroutine",nargs);
      return iVar1;
    }
    if ((long)(L->top).p - ((L->ci->func).offset + 0x10) >> 4 == (long)nargs) {
      iVar1 = resume_error(L,"cannot resume dead coroutine",nargs);
      return iVar1;
    }
  }
  else if (L->status != '\x01') {
    iVar1 = resume_error(L,"cannot resume dead coroutine",nargs);
    return iVar1;
  }
  if (from == (lua_State *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = from->nCcalls & 0xffff;
  }
  L->nCcalls = local_38;
  if ((L->nCcalls & 0xffff) < 200) {
    L->nCcalls = L->nCcalls + 1;
    status_00 = luaD_rawrunprotected(L,resume,(void *)((long)&nresults_local + 4));
    errcode = precover(from_local,status_00);
    if (1 < errcode) {
      from_local->status = errcode;
      luaD_seterrorobj(from_local,errcode,(from_local->top).p);
      from_local->ci->top = from_local->top;
    }
    if (errcode == 1) {
      local_3c = from_local->ci->u2;
    }
    else {
      local_3c.funcidx =
           (int)((long)(from_local->top).p - ((from_local->ci->func).offset + 0x10) >> 4);
    }
    *nresults = (int)local_3c;
    L_local._4_4_ = (uint)errcode;
  }
  else {
    L_local._4_4_ = resume_error(L,"C stack overflow",nargs);
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs,
                                      int *nresults) {
  TStatus status;
  lua_lock(L);
  if (L->status == LUA_OK) {  /* may be starting a coroutine */
    if (L->ci != &L->base_ci)  /* not in base level? */
      return resume_error(L, "cannot resume non-suspended coroutine", nargs);
    else if (L->top.p - (L->ci->func.p + 1) == nargs)  /* no function? */
      return resume_error(L, "cannot resume dead coroutine", nargs);
  }
  else if (L->status != LUA_YIELD)  /* ended with errors? */
    return resume_error(L, "cannot resume dead coroutine", nargs);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  if (getCcalls(L) >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow", nargs);
  L->nCcalls++;
  luai_userstateresume(L, nargs);
  api_checkpop(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, &nargs);
   /* continue running after recoverable errors */
  status = precover(L, status);
  if (l_likely(!errorstatus(status)))
    lua_assert(status == L->status);  /* normal end or yield */
  else {  /* unrecoverable error */
    L->status = status;  /* mark thread as 'dead' */
    luaD_seterrorobj(L, status, L->top.p);  /* push error message */
    L->ci->top.p = L->top.p;
  }
  *nresults = (status == LUA_YIELD) ? L->ci->u2.nyield
                                    : cast_int(L->top.p - (L->ci->func.p + 1));
  lua_unlock(L);
  return APIstatus(status);
}